

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O2

bool Omega_h::gmsh::anon_unknown_0::seek_optional_section(istream *stream,string *want)

{
  __type _Var1;
  istream *piVar2;
  long lVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  string line;
  
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    fail("assertion %s failed at %s +%d\n","stream",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
         ,0x6e);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  auVar5 = std::istream::tellg();
  do {
    do {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (stream,(string *)&line);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) goto LAB_0029cd2d;
      _Var1 = std::operator==(&line,want);
      if (_Var1) {
        bVar4 = true;
        goto LAB_0029cd54;
      }
    } while (line._M_string_length == 0);
    lVar3 = std::__cxx11::string::rfind((char *)&line,0x37dc6e);
  } while ((lVar3 == 0) || (*line._M_dataplus._M_p != '$'));
LAB_0029cd2d:
  std::ios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
  std::istream::seekg(stream,auVar5._0_8_,auVar5._8_8_);
  bVar4 = false;
LAB_0029cd54:
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    std::__cxx11::string::~string((string *)&line);
    return bVar4;
  }
  fail("assertion %s failed at %s +%d\n","stream",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
       ,0x80);
}

Assistant:

static bool seek_optional_section(
    std::istream& stream, std::string const& want) {
  OMEGA_H_CHECK(stream);
  std::string line;
  auto const pos = stream.tellg();
  bool found = false;
  while (std::getline(stream, line)) {
    if (line == want) {
      found = true;
      break;
    }
    if (!line.empty() && line.rfind("$End") != 0 && line[0] == '$') {
      // found the beginning of a new section that is not the one expected
      break;
    }
  }
  if (!found) {
    stream.clear();
    stream.seekg(pos);
  }
  OMEGA_H_CHECK(stream);
  return found;
}